

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5ApiPhraseNext(Fts5Context *pCtx,Fts5PhraseIter *pIter,int *piCol,int *piOff)

{
  u32 uVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  long in_FS_OFFSET;
  int iVal;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = pIter->a;
  if (puVar4 < pIter->b) {
    local_3c = 0xaaaaaaaa;
    uVar2 = sqlite3Fts5GetVarint32(puVar4,&local_3c);
    puVar4 = puVar4 + uVar2;
    pIter->a = puVar4;
    if (local_3c == 1) {
      iVar3 = *(int *)(*(long *)(*(long *)pCtx + 0x18) + 0x20);
      uVar2 = sqlite3Fts5GetVarint32(puVar4,&local_3c);
      puVar4 = puVar4 + uVar2;
      pIter->a = puVar4;
      uVar1 = iVar3 - 1;
      if ((int)local_3c < iVar3) {
        uVar1 = local_3c;
      }
      *piCol = uVar1;
      *piOff = 0;
      uVar2 = sqlite3Fts5GetVarint32(puVar4,&local_3c);
      pIter->a = puVar4 + uVar2;
      iVar3 = 0;
    }
    else {
      iVar3 = *piOff;
    }
    *piOff = local_3c + iVar3 + -2;
  }
  else {
    *piCol = -1;
    *piOff = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5ApiPhraseNext(
  Fts5Context *pCtx,
  Fts5PhraseIter *pIter,
  int *piCol, int *piOff
){
  if( pIter->a>=pIter->b ){
    *piCol = -1;
    *piOff = -1;
  }else{
    int iVal;
    pIter->a += fts5GetVarint32(pIter->a, iVal);
    if( iVal==1 ){
      /* Avoid returning a (*piCol) value that is too large for the table,
      ** even if the position-list is corrupt. The caller might not be
      ** expecting it.  */
      int nCol = ((Fts5Table*)(((Fts5Cursor*)pCtx)->base.pVtab))->pConfig->nCol;
      pIter->a += fts5GetVarint32(pIter->a, iVal);
      *piCol = (iVal>=nCol ? nCol-1 : iVal);
      *piOff = 0;
      pIter->a += fts5GetVarint32(pIter->a, iVal);
    }
    *piOff += (iVal-2);
  }
}